

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spend.cpp
# Opt level: O0

UniValue *
wallet::SendMoney(CWallet *wallet,CCoinControl *coin_control,
                 vector<wallet::CRecipient,_std::allocator<wallet::CRecipient>_> *recipients,
                 mapValue_t *map_value,bool verbose)

{
  __normal_iterator<wallet::CRecipient_*,_std::vector<wallet::CRecipient,_std::allocator<wallet::CRecipient>_>_>
  __first;
  bool bVar1;
  iterator wallet_00;
  iterator vecSend;
  undefined8 uVar2;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_RCX;
  mapValue_t *in_RDX;
  _Optional_payload_base<unsigned_int> in_RSI;
  CWallet *in_RDI;
  byte in_R9B;
  long in_FS_OFFSET;
  CTransactionRef *tx;
  UniValue *entry;
  Result<wallet::CreatedTransactionResult> res;
  FastRandomContext *in_stack_fffffffffffffb68;
  undefined7 in_stack_fffffffffffffb70;
  undefined1 in_stack_fffffffffffffb77;
  CWallet *in_stack_fffffffffffffb78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffb80;
  UniValue *in_stack_fffffffffffffb88;
  CWallet *in_stack_fffffffffffffb90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffba0;
  UniValue *val;
  string *in_stack_fffffffffffffba8;
  char *in_stack_fffffffffffffbb0;
  UniValue *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffbb8;
  int code;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  FastRandomContext *in_stack_fffffffffffffbd0;
  __normal_iterator<wallet::CRecipient_*,_std::vector<wallet::CRecipient,_std::allocator<wallet::CRecipient>_>_>
  in_stack_fffffffffffffc20;
  undefined1 sign;
  undefined6 in_stack_fffffffffffffc28;
  undefined1 in_stack_fffffffffffffc2e;
  undefined1 in_stack_fffffffffffffc2f;
  FeeReason in_stack_fffffffffffffc44;
  _Optional_payload_base<unsigned_int> tx_00;
  CWallet *this_01;
  allocator<char> local_37a;
  allocator<char> local_379;
  undefined8 local_378;
  undefined8 uStack_370;
  undefined8 local_368;
  undefined1 local_358 [368];
  UniValue local_1e8 [5];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = in_RDI;
  EnsureWalletIsUnlocked(in_stack_fffffffffffffb90);
  bVar1 = CWallet::IsWalletFlagSet
                    (in_stack_fffffffffffffb78,
                     CONCAT17(in_stack_fffffffffffffb77,in_stack_fffffffffffffb70));
  if (bVar1) {
    uVar2 = __cxa_allocate_exception(0x58);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffbb8,in_stack_fffffffffffffbb0,
               (allocator<char> *)in_stack_fffffffffffffba8);
    JSONRPCError((int)((ulong)in_stack_fffffffffffffbb8 >> 0x20),in_stack_fffffffffffffba8);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
      __cxa_throw(uVar2,&UniValue::typeinfo,UniValue::~UniValue);
    }
  }
  else {
    wallet_00 = std::vector<wallet::CRecipient,_std::allocator<wallet::CRecipient>_>::begin
                          ((vector<wallet::CRecipient,_std::allocator<wallet::CRecipient>_> *)
                           CONCAT17(in_stack_fffffffffffffb77,in_stack_fffffffffffffb70));
    code = (int)((ulong)in_stack_fffffffffffffbb8 >> 0x20);
    vecSend = std::vector<wallet::CRecipient,_std::allocator<wallet::CRecipient>_>::end
                        ((vector<wallet::CRecipient,_std::allocator<wallet::CRecipient>_> *)
                         CONCAT17(in_stack_fffffffffffffb77,in_stack_fffffffffffffb70));
    FastRandomContext::FastRandomContext
              ((FastRandomContext *)in_stack_fffffffffffffb78,(bool)in_stack_fffffffffffffb77);
    __first._M_current._6_1_ = in_stack_fffffffffffffc2e;
    __first._M_current._0_6_ = in_stack_fffffffffffffc28;
    __first._M_current._7_1_ = in_stack_fffffffffffffc2f;
    std::
    shuffle<__gnu_cxx::__normal_iterator<wallet::CRecipient*,std::vector<wallet::CRecipient,std::allocator<wallet::CRecipient>>>,FastRandomContext>
              (__first,in_stack_fffffffffffffc20,in_stack_fffffffffffffbd0);
    sign = (undefined1)((ulong)in_stack_fffffffffffffc20._M_current >> 0x38);
    FastRandomContext::~FastRandomContext(in_stack_fffffffffffffb68);
    std::optional<unsigned_int>::optional((optional<unsigned_int> *)(local_358 + 0x18));
    CreateTransaction((CWallet *)wallet_00._M_current,
                      (vector<wallet::CRecipient,_std::allocator<wallet::CRecipient>_> *)
                      vecSend._M_current,(optional<unsigned_int>)in_RSI,
                      (CCoinControl *)
                      CONCAT17(in_stack_fffffffffffffc2f,
                               CONCAT16(in_stack_fffffffffffffc2e,in_stack_fffffffffffffc28)),
                      (bool)sign);
    bVar1 = util::Result::operator_cast_to_bool
                      ((Result<wallet::CreatedTransactionResult> *)in_stack_fffffffffffffb68);
    if (bVar1) {
      util::Result<wallet::CreatedTransactionResult>::operator->
                ((Result<wallet::CreatedTransactionResult> *)in_stack_fffffffffffffb68);
      this = (UniValue *)local_358;
      tx_00 = in_RSI;
      std::shared_ptr<const_CTransaction>::shared_ptr
                ((shared_ptr<const_CTransaction> *)in_stack_fffffffffffffb68,
                 (shared_ptr<const_CTransaction> *)0x1815045);
      this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                ((long)&local_1e8[0].val.field_2 + 8);
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)in_stack_fffffffffffffb68,
            (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)0x181505f);
      local_378 = 0;
      uStack_370 = 0;
      local_368 = 0;
      std::
      vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)in_stack_fffffffffffffb68);
      CWallet::CommitTransaction(this_01,(CTransactionRef *)tx_00,in_RDX,in_RCX);
      std::
      vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)in_stack_fffffffffffffb78);
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)in_stack_fffffffffffffb68);
      std::shared_ptr<const_CTransaction>::~shared_ptr
                ((shared_ptr<const_CTransaction> *)in_stack_fffffffffffffb68);
      if ((in_R9B & 1) == 0) {
        std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)in_stack_fffffffffffffb68);
        CTransaction::GetHash((CTransaction *)in_stack_fffffffffffffb68);
        transaction_identifier<false>::GetHex_abi_cxx11_
                  ((transaction_identifier<false> *)
                   CONCAT17(in_stack_fffffffffffffb77,in_stack_fffffffffffffb70));
        UniValue::
        UniValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                  ((UniValue *)in_RSI,in_stack_fffffffffffffba0);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffb68);
      }
      else {
        val = local_1e8;
        std::__cxx11::string::string(in_stack_fffffffffffffb80);
        UniValue::UniValue(in_stack_fffffffffffffb88,
                           (VType)((ulong)in_stack_fffffffffffffb80 >> 0x20),
                           (string *)in_stack_fffffffffffffb78);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffb68);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (this_00,(char *)this,(allocator<char> *)in_RSI);
        std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)in_stack_fffffffffffffb68);
        CTransaction::GetHash((CTransaction *)in_stack_fffffffffffffb68);
        transaction_identifier<false>::GetHex_abi_cxx11_
                  ((transaction_identifier<false> *)
                   CONCAT17(in_stack_fffffffffffffb77,in_stack_fffffffffffffb70));
        UniValue::
        UniValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                  ((UniValue *)in_RSI,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)val);
        UniValue::pushKV(this,(string *)in_RSI,val);
        UniValue::~UniValue((UniValue *)in_stack_fffffffffffffb68);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffb68);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffb68);
        std::allocator<char>::~allocator(&local_379);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (this_00,(char *)this,(allocator<char> *)in_RSI);
        util::Result<wallet::CreatedTransactionResult>::operator->
                  ((Result<wallet::CreatedTransactionResult> *)in_stack_fffffffffffffb68);
        common::StringForFeeReason_abi_cxx11_(in_stack_fffffffffffffc44);
        UniValue::
        UniValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                  ((UniValue *)in_RSI,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)val);
        UniValue::pushKV(this,(string *)in_RSI,val);
        UniValue::~UniValue((UniValue *)in_stack_fffffffffffffb68);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffb68);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffb68);
        std::allocator<char>::~allocator(&local_37a);
      }
      util::Result<wallet::CreatedTransactionResult>::~Result
                ((Result<wallet::CreatedTransactionResult> *)in_stack_fffffffffffffb68);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
        return (UniValue *)in_RDI;
      }
    }
    else {
      uVar2 = __cxa_allocate_exception(0x58);
      util::ErrorString<wallet::CreatedTransactionResult>
                ((Result<wallet::CreatedTransactionResult> *)in_stack_fffffffffffffba0);
      JSONRPCError(code,in_stack_fffffffffffffba8);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
        __cxa_throw(uVar2,&UniValue::typeinfo,UniValue::~UniValue);
      }
    }
  }
  __stack_chk_fail();
}

Assistant:

UniValue SendMoney(CWallet& wallet, const CCoinControl &coin_control, std::vector<CRecipient> &recipients, mapValue_t map_value, bool verbose)
{
    EnsureWalletIsUnlocked(wallet);

    // This function is only used by sendtoaddress and sendmany.
    // This should always try to sign, if we don't have private keys, don't try to do anything here.
    if (wallet.IsWalletFlagSet(WALLET_FLAG_DISABLE_PRIVATE_KEYS)) {
        throw JSONRPCError(RPC_WALLET_ERROR, "Error: Private keys are disabled for this wallet");
    }

    // Shuffle recipient list
    std::shuffle(recipients.begin(), recipients.end(), FastRandomContext());

    // Send
    auto res = CreateTransaction(wallet, recipients, /*change_pos=*/std::nullopt, coin_control, true);
    if (!res) {
        throw JSONRPCError(RPC_WALLET_INSUFFICIENT_FUNDS, util::ErrorString(res).original);
    }
    const CTransactionRef& tx = res->tx;
    wallet.CommitTransaction(tx, std::move(map_value), /*orderForm=*/{});
    if (verbose) {
        UniValue entry(UniValue::VOBJ);
        entry.pushKV("txid", tx->GetHash().GetHex());
        entry.pushKV("fee_reason", StringForFeeReason(res->fee_calc.reason));
        return entry;
    }
    return tx->GetHash().GetHex();
}